

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::whileStmt(Parser *this)

{
  Report *this_00;
  Lexer *pLVar1;
  bool bVar2;
  Parser *in_RSI;
  allocator<char> local_81;
  long *local_80;
  _Head_base<0UL,_flow::lang::Stmt_*,_false> local_78;
  undefined1 local_70 [32];
  SourceLocation sloc;
  
  SourceLocation::SourceLocation
            (&sloc,&((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  consume(in_RSI,While);
  logicExpr((Parser *)&local_78);
  stmt((Parser *)&local_80);
  bVar2 = hasFeature(in_RSI,WhileLoop);
  if (!bVar2) {
    this_00 = in_RSI->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"While-loop feature not enabled.",&local_81);
    diagnostics::Report::syntaxError<>(this_00,&sloc,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  pLVar1 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  sloc.end.offset = (pLVar1->lastLocation_).end.offset;
  sloc.end.line = (pLVar1->lastLocation_).end.line;
  sloc.end.column = (pLVar1->lastLocation_).end.column;
  std::
  make_unique<flow::lang::WhileStmt,flow::SourceLocation&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>>
            ((SourceLocation *)local_70,
             (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&sloc,
             (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)&local_78);
  *(undefined8 *)&(this->features_)._M_t._M_impl = local_70._0_8_;
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  if (local_78._M_head_impl != (Stmt *)0x0) {
    (*((local_78._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
  }
  std::__cxx11::string::~string((string *)&sloc);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::whileStmt() {
  // whileStmt ::= 'while' expr stmt
  SourceLocation sloc(location());

  consume(Token::While);
  std::unique_ptr<Expr> cond = expr();
  std::unique_ptr<Stmt> body = stmt();

  if (!hasFeature(Feature::WhileLoop))
    report_.syntaxError(sloc, "While-loop feature not enabled.");

  return std::make_unique<WhileStmt>(sloc.update(end()), std::move(cond), std::move(body));
}